

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

void aom_fft2x2_float_c(float *input,float *temp,float *output)

{
  float fVar1;
  float fVar2;
  int x;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  int x_1;
  long lVar6;
  
  lVar3 = 0;
  do {
    fVar1 = input[lVar3];
    fVar2 = input[lVar3 + 2];
    output[lVar3] = fVar1 + fVar2;
    output[lVar3 + 2] = fVar1 - fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  pfVar4 = output;
  pfVar5 = temp;
  do {
    lVar6 = 0;
    do {
      pfVar5[lVar6] = pfVar4[lVar6 * 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    lVar3 = lVar3 + 1;
    pfVar5 = pfVar5 + 2;
    pfVar4 = pfVar4 + 1;
  } while (lVar3 != 2);
  lVar3 = 0;
  do {
    fVar1 = temp[lVar3];
    fVar2 = temp[lVar3 + 2];
    output[lVar3] = fVar1 + fVar2;
    output[lVar3 + 2] = fVar1 - fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  pfVar4 = output;
  pfVar5 = temp;
  do {
    lVar6 = 0;
    do {
      pfVar5[lVar6] = pfVar4[lVar6 * 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    lVar3 = lVar3 + 1;
    pfVar5 = pfVar5 + 2;
    pfVar4 = pfVar4 + 1;
  } while (lVar3 != 2);
  pfVar4 = output + 1;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar4[lVar6 * 2 + -1] = temp[lVar6];
      pfVar4[lVar6 * 2] = 0.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    lVar3 = lVar3 + 1;
    pfVar4 = pfVar4 + 4;
    temp = temp + 2;
  } while (lVar3 != 2);
  return;
}

Assistant:

void aom_fft2x2_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 2, aom_fft1d_2_float, simple_transpose,
                 unpack_2d_output, 1);
}